

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

void print_type(CrispyValue value)

{
  switch(value.type) {
  case NIL:
    puts(" : NIL");
    return;
  case NUMBER:
    puts(" : NUMBER");
    return;
  case OBJECT:
    print_object_type(value);
    return;
  case BOOLEAN:
    puts(" : BOOLEAN");
    return;
  default:
    return;
  }
}

Assistant:

void print_type(CrispyValue value) {
    switch (value.type) {
        case NUMBER:
            printf(" : NUMBER\n");
            break;
        case BOOLEAN:
            printf(" : BOOLEAN\n");
            break;
        case OBJECT:
            print_object_type(value);
            break;
        case NIL:
            printf(" : NIL\n");
            break;
    }
}